

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O2

wchar_t scp_finish_filerecv(void)

{
  FILE *stream;
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  sftp_packet *psVar4;
  sftp_request *req;
  char *pcVar5;
  void *vbuf;
  wchar_t len;
  
  if (!using_sftp) {
    (*backend->vt->send)(backend,anon_var_dwarf_3291b + 10,1);
    wVar3 = response();
    return wVar3;
  }
  xfer_set_error(scp_sftp_xfer);
  while( true ) {
    _Var1 = xfer_done(scp_sftp_xfer);
    if (_Var1) {
      xfer_cleanup(scp_sftp_xfer);
      req = fxp_close_send(scp_sftp_filehandle);
      psVar4 = sftp_wait_for_reply(req);
      fxp_close_recv(psVar4,req);
      return L'\0';
    }
    psVar4 = sftp_recv();
    iVar2 = xfer_download_gotpkt(scp_sftp_xfer,psVar4);
    stream = _stderr;
    if (iVar2 < 1) break;
    _Var1 = xfer_download_data(scp_sftp_xfer,&vbuf,&len);
    if (_Var1) {
      safefree(vbuf);
    }
  }
  pcVar5 = fxp_error();
  tell_user(stream,"pscp: error while reading: %s",pcVar5);
  errs = errs + L'\x01';
  return L'\xffffffff';
}

Assistant:

int scp_finish_filerecv(void)
{
    if (using_sftp) {
        struct sftp_packet *pktin;
        struct sftp_request *req;

        /*
         * Ensure that xfer_done() will work correctly, so we can
         * clean up any outstanding requests from the file
         * transfer.
         */
        xfer_set_error(scp_sftp_xfer);
        while (!xfer_done(scp_sftp_xfer)) {
            void *vbuf;
            int ret, len;

            pktin = sftp_recv();
            ret = xfer_download_gotpkt(scp_sftp_xfer, pktin);
            if (ret <= 0) {
                tell_user(stderr, "pscp: error while reading: %s", fxp_error());
                if (ret == INT_MIN)        /* pktin not even freed */
                    sfree(pktin);
                errs++;
                return -1;
            }
            if (xfer_download_data(scp_sftp_xfer, &vbuf, &len))
                sfree(vbuf);
        }
        xfer_cleanup(scp_sftp_xfer);

        req = fxp_close_send(scp_sftp_filehandle);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);
        return 0;
    } else {
        backend_send(backend, "", 1);
        return response();
    }
}